

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Abc_Ntk_t * Abc_SclUnBufferPerform(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  int nNodesOld;
  int iLit;
  int k;
  int i;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vLits;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkObjNumMax(pNtk);
  iVar2 = Abc_NtkObjNumMax(pNtk);
  p = Vec_IntStartFull(iVar2);
  for (iLit = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), iLit < iVar2; iLit = iLit + 1) {
    pAVar5 = Abc_NtkObj(pNtk,iLit);
    if (((pAVar5 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar5), iVar2 != 0)) &&
       (iVar2 = Abc_SclIsInv(pAVar5), iVar2 != 0)) {
      pAVar6 = Abc_ObjFanin0(pAVar5);
      iVar2 = Abc_SclObjIsBufInv(pAVar6);
      if (iVar2 == 0) {
        iVar2 = Abc_ObjFaninId0(pAVar5);
        uVar4 = Abc_ObjId(pAVar5);
        Vec_IntWriteEntry(p,iVar2,uVar4);
      }
    }
  }
  for (iLit = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), iLit < iVar2; iLit = iLit + 1) {
    pAVar5 = Abc_NtkObj(pNtk,iLit);
    if ((pAVar5 != (Abc_Obj_t *)0x0) &&
       ((iVar2 = Abc_ObjIsNode(pAVar5), iVar2 != 0 || (iVar2 = Abc_ObjIsCo(pAVar5), iVar2 != 0)))) {
      if (iVar1 <= iLit) break;
      for (nNodesOld = 0; iVar2 = Abc_ObjFaninNum(pAVar5), nNodesOld < iVar2;
          nNodesOld = nNodesOld + 1) {
        pAVar6 = Abc_ObjFanin(pAVar5,nNodesOld);
        iVar2 = Abc_SclObjIsBufInv(pAVar6);
        if (iVar2 != 0) {
          iVar2 = Abc_SclGetRealFaninLit(pAVar6);
          iVar3 = Abc_Lit2Var(iVar2);
          _k = Abc_NtkObj(pNtk,iVar3);
          iVar3 = Abc_LitIsCompl(iVar2);
          if (iVar3 != 0) {
            iVar3 = Abc_Lit2Var(iVar2);
            iVar3 = Vec_IntEntry(p,iVar3);
            if (iVar3 == -1) {
              _k = Abc_NtkCreateNodeInv(pNtk,_k);
              iVar2 = Abc_Lit2Var(iVar2);
              uVar4 = Abc_ObjId(_k);
              Vec_IntWriteEntry(p,iVar2,uVar4);
            }
            else {
              iVar2 = Abc_Lit2Var(iVar2);
              iVar2 = Vec_IntEntry(p,iVar2);
              _k = Abc_NtkObj(pNtk,iVar2);
            }
            iVar2 = Abc_ObjFaninNum(_k);
            if (iVar2 != 1) {
              __assert_fail("Abc_ObjFaninNum(pFaninNew) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclBuffer.c"
                            ,0x9f,"Abc_Ntk_t *Abc_SclUnBufferPerform(Abc_Ntk_t *, int)");
            }
          }
          if (pAVar6 != _k) {
            Abc_ObjPatchFanin(pAVar5,pAVar6,_k);
          }
        }
      }
    }
  }
  Vec_IntFree(p);
  pAVar7 = Abc_NtkDupDfs(pNtk);
  return pAVar7;
}

Assistant:

Abc_Ntk_t * Abc_SclUnBufferPerform( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vLits;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int i, k, iLit, nNodesOld = Abc_NtkObjNumMax(pNtk);
    // assign inverters
    vLits = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_SclIsInv(pObj) && !Abc_SclObjIsBufInv(Abc_ObjFanin0(pObj)) )
            Vec_IntWriteEntry( vLits, Abc_ObjFaninId0(pObj), Abc_ObjId(pObj) );
    // transfer fanins
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_SclObjIsBufInv(pFanin) )
                continue;
            iLit = Abc_SclGetRealFaninLit( pFanin );
            pFaninNew = Abc_NtkObj( pNtk, Abc_Lit2Var(iLit) );
            if ( Abc_LitIsCompl(iLit) )
            {
                if ( Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) == -1 )
                {
                    pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFaninNew );
                    Vec_IntWriteEntry( vLits, Abc_Lit2Var(iLit), Abc_ObjId(pFaninNew) );
                }
                else
                    pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) );
                assert( Abc_ObjFaninNum(pFaninNew) == 1 );
            }
            if ( pFanin != pFaninNew )
                Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
        }
    }
    Vec_IntFree( vLits );
    // duplicate network in topo order
    return Abc_NtkDupDfs( pNtk );
}